

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O3

OPJ_BOOL opj_t2_init_seg(opj_tcd_cblk_dec_t *cblk,OPJ_UINT32 index,OPJ_UINT32 cblksty,
                        OPJ_UINT32 first)

{
  opj_tcd_seg_t *poVar1;
  OPJ_UINT32 OVar2;
  uint uVar3;
  
  if (cblk->m_current_max_segs < index + 1) {
    uVar3 = cblk->m_current_max_segs + 10;
    poVar1 = (opj_tcd_seg_t *)opj_realloc(cblk->segs,(ulong)uVar3 * 0x18);
    if (poVar1 == (opj_tcd_seg_t *)0x0) {
      return 0;
    }
    cblk->segs = poVar1;
    memset(poVar1 + cblk->m_current_max_segs,0,0xf0);
    cblk->m_current_max_segs = uVar3;
  }
  poVar1 = cblk->segs + index;
  opj_tcd_reinit_segment(poVar1);
  OVar2 = 1;
  if ((((cblksty & 4) == 0) && (OVar2 = 0x6d, (cblksty & 1) != 0)) && (OVar2 = 10, first == 0)) {
    OVar2 = (poVar1[-1].maxpasses == 10 || poVar1[-1].maxpasses == 1) + 1;
  }
  poVar1->maxpasses = OVar2;
  return 1;
}

Assistant:

static OPJ_BOOL opj_t2_init_seg(opj_tcd_cblk_dec_t* cblk,
                                OPJ_UINT32 index,
                                OPJ_UINT32 cblksty,
                                OPJ_UINT32 first)
{
    opj_tcd_seg_t* seg = 00;
    OPJ_UINT32 l_nb_segs = index + 1;

    if (l_nb_segs > cblk->m_current_max_segs) {
        opj_tcd_seg_t* new_segs;
        OPJ_UINT32 l_m_current_max_segs = cblk->m_current_max_segs +
                                          OPJ_J2K_DEFAULT_NB_SEGS;

        new_segs = (opj_tcd_seg_t*) opj_realloc(cblk->segs,
                                                l_m_current_max_segs * sizeof(opj_tcd_seg_t));
        if (! new_segs) {
            /* opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to initialize segment %d\n", l_nb_segs); */
            return OPJ_FALSE;
        }
        cblk->segs = new_segs;
        memset(new_segs + cblk->m_current_max_segs,
               0, OPJ_J2K_DEFAULT_NB_SEGS * sizeof(opj_tcd_seg_t));
        cblk->m_current_max_segs = l_m_current_max_segs;
    }

    seg = &cblk->segs[index];
    opj_tcd_reinit_segment(seg);

    if (cblksty & J2K_CCP_CBLKSTY_TERMALL) {
        seg->maxpasses = 1;
    } else if (cblksty & J2K_CCP_CBLKSTY_LAZY) {
        if (first) {
            seg->maxpasses = 10;
        } else {
            seg->maxpasses = (((seg - 1)->maxpasses == 1) ||
                              ((seg - 1)->maxpasses == 10)) ? 2 : 1;
        }
    } else {
        /* See paragraph "B.10.6 Number of coding passes" of the standard.
         * Probably that 109 must be interpreted a (Mb-1)*3 + 1 with Mb=37,
         * Mb being the maximum number of bit-planes available for the
         * representation of coefficients in the sub-band */
        seg->maxpasses = 109;
    }

    return OPJ_TRUE;
}